

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

string * __thiscall
PlanningUnitMADPDiscrete::SoftPrintPolicyDomainElement_abi_cxx11_
          (PlanningUnitMADPDiscrete *this,Index agentI,Index dI,PolicyDomainCategory cat)

{
  undefined8 uVar1;
  Index in_ECX;
  Index in_EDX;
  PlanningUnitMADPDiscrete *in_RSI;
  ActionObservationHistoryTree *in_RDI;
  int in_R8D;
  string *s;
  ActionObservationHistory *in_stack_00000248;
  undefined8 in_stack_ffffffffffffffa8;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_R8D == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  if (in_R8D == 1) {
    SoftPrintObservationHistory_abi_cxx11_((string *)in_RDI,in_RSI,in_EDX,in_ECX);
  }
  else {
    if (in_R8D != 2) {
      uVar1 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      __cxa_throw(uVar1,&E::typeinfo,E::~E);
    }
    GetActionObservationHistoryTree
              (in_stack_ffffffffffffffb0,(Index)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
               (Index)in_stack_ffffffffffffffa8);
    ActionObservationHistoryTree::GetActionObservationHistory(in_RDI);
    ActionObservationHistory::SoftPrint_abi_cxx11_(in_stack_00000248);
  }
  return (string *)in_RDI;
}

Assistant:

string PlanningUnitMADPDiscrete::SoftPrintPolicyDomainElement(
    Index agentI, Index dI, PolicyGlobals::PolicyDomainCategory cat ) const
{
    switch ( cat )
    {
    case PolicyGlobals::OHIST_INDEX :
        {
            string s = SoftPrintObservationHistory(agentI, dI);
            return s;


            break;
        }
    case PolicyGlobals::AOHIST_INDEX :
        return GetActionObservationHistoryTree(agentI,dI)->
            GetActionObservationHistory()->SoftPrint();
        break;
    case PolicyGlobals::TYPE_INDEX : 
        throw(E("SoftPrintPolicyDomain: types are not a valid policy domain for a PlanningUnitMADPDiscrete"));
        break;
    default:
        throw(E("SoftPrintPolicyDomain: incorrect JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory"));
        break;
    }
    return("IMPOSSIBLE!");
}